

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_quit(connectdata *conn)

{
  SessionHandle *data;
  CURLcode error;
  char *pcVar1;
  CURLcode local_1c;
  CURLcode result;
  connectdata *conn_local;
  
  local_1c = CURLE_OK;
  if (((conn->proto).ftpc.ctl_valid & 1U) != 0) {
    error = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s","QUIT");
    if (error != CURLE_OK) {
      data = conn->data;
      pcVar1 = curl_easy_strerror(error);
      Curl_failf(data,"Failure sending QUIT command: %s",pcVar1);
      (conn->proto).ftpc.ctl_valid = false;
      (conn->bits).close = true;
      _state(conn,FTP_STOP);
      return error;
    }
    _state(conn,FTP_QUIT);
    local_1c = ftp_block_statemach(conn);
  }
  return local_1c;
}

Assistant:

static CURLcode ftp_quit(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;

  if(conn->proto.ftpc.ctl_valid) {
    result = Curl_pp_sendf(&conn->proto.ftpc.pp, "%s", "QUIT");
    if(result) {
      failf(conn->data, "Failure sending QUIT command: %s",
            curl_easy_strerror(result));
      conn->proto.ftpc.ctl_valid = FALSE; /* mark control connection as bad */
      connclose(conn, "QUIT command failed"); /* mark for connection closure */
      state(conn, FTP_STOP);
      return result;
    }

    state(conn, FTP_QUIT);

    result = ftp_block_statemach(conn);
  }

  return result;
}